

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_envelopes(xm_channel_context_t *ch)

{
  float *in_RDI;
  xm_envelope_t *in_stack_00000008;
  xm_channel_context_t *in_stack_00000010;
  
  if (*(long *)(in_RDI + 2) != 0) {
    if ((*(byte *)(*(long *)(in_RDI + 2) + 0x96) & 1) != 0) {
      if (((*(byte *)((long)in_RDI + 0x3e) & 1) == 0) &&
         (in_RDI[0x10] = in_RDI[0x10] - (float)*(ushort *)(*(long *)(in_RDI + 2) + 0xdc) / 32768.0,
         in_RDI[0x10] <= 0.0 && in_RDI[0x10] != 0.0)) {
        in_RDI[0x10] = 0.0;
      }
      xm_envelope_tick(in_stack_00000010,in_stack_00000008,(uint16_t *)ch,in_RDI);
    }
    if ((*(byte *)(*(long *)(in_RDI + 2) + 0xce) & 1) != 0) {
      xm_envelope_tick(in_stack_00000010,in_stack_00000008,(uint16_t *)ch,in_RDI);
    }
  }
  return;
}

Assistant:

static void xm_envelopes(xm_channel_context_t* ch) {
	if(ch->instrument != NULL) {
		if(ch->instrument->volume_envelope.enabled) {
			if(!ch->sustained) {
				ch->fadeout_volume -= (float)ch->instrument->volume_fadeout / 32768.f;
				XM_CLAMP_DOWN(ch->fadeout_volume);
			}

			xm_envelope_tick(ch,
							 &(ch->instrument->volume_envelope),
							 &(ch->volume_envelope_frame_count),
							 &(ch->volume_envelope_volume));
		}

		if(ch->instrument->panning_envelope.enabled) {
			xm_envelope_tick(ch,
							 &(ch->instrument->panning_envelope),
							 &(ch->panning_envelope_frame_count),
							 &(ch->panning_envelope_panning));
		}
	}
}